

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O3

void printEdge(Edge *i_edge,int length)

{
  ulong uVar1;
  
  fprintf(_stdout,"Solution with %d edges ",(ulong)(uint)length);
  if (0 < length) {
    uVar1 = 0;
    do {
      fprintf(_stdout,"%d-%d ",(ulong)(uint)i_edge[uVar1].start,(ulong)(uint)i_edge[uVar1].end);
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
  }
  fputc(10,_stdout);
  return;
}

Assistant:

void printEdge(const Edge *i_edge, int length)
{
    fprintf(stdout, "Solution with %d edges ", length);
    for (int i = 0; i < length; i++)
    {
        fprintf(stdout, "%d-%d ", i_edge[i].start, i_edge[i].end);
    }
    fprintf(stdout, "\n");
}